

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seekforintruder.cpp
# Opt level: O3

string * sfi::logic::dotToDotDec(string *__return_storage_ptr__,string *str,int base)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  istream *piVar4;
  int *piVar5;
  ulong uVar6;
  long *plVar7;
  string *psVar8;
  undefined8 uVar9;
  ulong uVar10;
  long *plVar11;
  ulong __val;
  uint __len;
  exception e;
  string result;
  string __str;
  string octet;
  istringstream stream;
  long *local_238;
  long local_230;
  long local_228;
  long lStack_220;
  string *local_218;
  undefined1 *local_210 [2];
  undefined1 local_200 [16];
  undefined1 *local_1f0 [2];
  undefined1 local_1e0 [16];
  long *local_1d0;
  undefined8 local_1c8;
  undefined1 local_1c0 [16];
  istringstream local_1b0 [120];
  ios_base local_138 [264];
  
  local_218 = __return_storage_ptr__;
  std::__cxx11::istringstream::istringstream(local_1b0,(string *)str,_S_in);
  local_1d0 = (long *)local_1c0;
  local_1c8 = 0;
  local_1c0[0] = 0;
  local_210[0] = local_200;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"");
  while( true ) {
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_1b0,(string *)&local_1d0,'.');
    plVar7 = local_1d0;
    if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) {
      std::__cxx11::string::substr((ulong)local_218,(ulong)local_210);
      if (local_210[0] != local_200) {
        operator_delete(local_210[0]);
      }
      if (local_1d0 != (long *)local_1c0) {
        operator_delete(local_1d0);
      }
      std::__cxx11::istringstream::~istringstream(local_1b0);
      psVar8 = (string *)std::ios_base::~ios_base(local_138);
      return psVar8;
    }
    piVar5 = __errno_location();
    iVar1 = *piVar5;
    *piVar5 = 0;
    uVar6 = strtoul((char *)plVar7,(char **)&local_238,base);
    if (local_238 == plVar7) break;
    if (*piVar5 == 0) {
      *piVar5 = iVar1;
    }
    else if (*piVar5 == 0x22) goto LAB_001045d5;
    __val = -uVar6;
    if (0 < (long)uVar6) {
      __val = uVar6;
    }
    __len = 1;
    if (9 < __val) {
      uVar10 = __val;
      uVar3 = 4;
      do {
        __len = uVar3;
        if (uVar10 < 100) {
          __len = __len - 2;
          goto LAB_0010449a;
        }
        if (uVar10 < 1000) {
          __len = __len - 1;
          goto LAB_0010449a;
        }
        if (uVar10 < 10000) goto LAB_0010449a;
        bVar2 = 99999 < uVar10;
        uVar10 = uVar10 / 10000;
        uVar3 = __len + 4;
      } while (bVar2);
      __len = __len + 1;
    }
LAB_0010449a:
    local_1f0[0] = local_1e0;
    std::__cxx11::string::_M_construct((ulong)local_1f0,(char)__len - (char)((long)uVar6 >> 0x3f));
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_1f0[0] + -((long)uVar6 >> 0x3f),__len,__val);
    plVar7 = (long *)std::__cxx11::string::append((char *)local_1f0);
    plVar11 = plVar7 + 2;
    if ((long *)*plVar7 == plVar11) {
      local_228 = *plVar11;
      lStack_220 = plVar7[3];
      local_238 = &local_228;
    }
    else {
      local_228 = *plVar11;
      local_238 = (long *)*plVar7;
    }
    local_230 = plVar7[1];
    *plVar7 = (long)plVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_210,(ulong)local_238);
    if (local_238 != &local_228) {
      operator_delete(local_238);
    }
    if (local_1f0[0] != local_1e0) {
      operator_delete(local_1f0[0]);
    }
  }
  std::__throw_invalid_argument("stoul");
LAB_001045d5:
  uVar9 = std::__throw_out_of_range("stoul");
  if (local_210[0] != local_200) {
    operator_delete(local_210[0]);
  }
  if (local_1d0 != (long *)local_1c0) {
    operator_delete(local_1d0);
  }
  std::__cxx11::istringstream::~istringstream(local_1b0);
  std::ios_base::~ios_base(local_138);
  _Unwind_Resume(uVar9);
}

Assistant:

static string sfi::logic::dotToDotDec(const string& str, int base){
    istringstream stream(str);
    string octet;
    string result{""};
    long oct;
    while(getline(stream,octet,'.')){
            try {
                oct = stoul(octet, nullptr, base);
            } catch (exception e){
                return "0";
            }
            result += to_string(oct) + ".";
    }
    return result.substr(0,result.length()-1);
}